

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack-opts.cpp
# Opt level: O2

bool __thiscall wasm::StackIROptimizer::isControlFlowBegin(StackIROptimizer *this,StackInst *inst)

{
  return (bool)((byte)(0x214a >> ((byte)inst->op & 0x1f)) & inst->op < TryTableEnd);
}

Assistant:

bool StackIROptimizer::isControlFlowBegin(StackInst* inst) {
  switch (inst->op) {
    case StackInst::BlockBegin:
    case StackInst::IfBegin:
    case StackInst::LoopBegin:
    case StackInst::TryBegin:
    case StackInst::TryTableBegin: {
      return true;
    }
    default: {
      return false;
    }
  }
}